

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O1

JsonDocument __thiscall json::JsonDocument::createFromStream(JsonDocument *this,istream *input)

{
  JsonNode *in_RAX;
  runtime_error *this_00;
  unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_> root;
  _Head_base<0UL,_json::JsonNode_*,_false> local_18;
  
  if (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0) {
    local_18._M_head_impl = in_RAX;
    JsonParser::parse((JsonParser *)&local_18,input);
    (this->root)._M_t.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>.
    _M_t.super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
    super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl = local_18._M_head_impl;
    return (unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>)
           (unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"The input stream was bad");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

JsonDocument JsonDocument::createFromStream(std::istream &input)
    {
        if (!input.good())
            throw std::runtime_error("The input stream was bad");
        std::unique_ptr<JsonNode> root = JsonParser::parse(input);
        return JsonDocument(std::move(root));
    }